

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void copy_stemmer(char *zIn,int nIn,char *zOut,int *pnOut)

{
  char cVar1;
  bool bVar2;
  char c;
  int hasDigit;
  int j;
  int mx;
  int i;
  int *pnOut_local;
  char *zOut_local;
  int nIn_local;
  char *zIn_local;
  
  bVar2 = false;
  for (i = 0; i < nIn; i = i + 1) {
    cVar1 = zIn[i];
    if ((cVar1 < 'A') || ('Z' < cVar1)) {
      if (('/' < cVar1) && (cVar1 < ':')) {
        bVar2 = true;
      }
      zOut[i] = cVar1;
    }
    else {
      zOut[i] = cVar1 + ' ';
    }
  }
  j = 10;
  if (bVar2) {
    j = 3;
  }
  if (nIn != j * 2 && SBORROW4(nIn,j * 2) == nIn + j * -2 < 0) {
    for (i = nIn - j; i < nIn; i = i + 1) {
      zOut[j] = zOut[i];
      j = j + 1;
    }
    i = j;
  }
  zOut[i] = '\0';
  *pnOut = i;
  return;
}

Assistant:

static void copy_stemmer(const char *zIn, int nIn, char *zOut, int *pnOut){
  int i, mx, j;
  int hasDigit = 0;
  for(i=0; i<nIn; i++){
    char c = zIn[i];
    if( c>='A' && c<='Z' ){
      zOut[i] = c - 'A' + 'a';
    }else{
      if( c>='0' && c<='9' ) hasDigit = 1;
      zOut[i] = c;
    }
  }
  mx = hasDigit ? 3 : 10;
  if( nIn>mx*2 ){
    for(j=mx, i=nIn-mx; i<nIn; i++, j++){
      zOut[j] = zOut[i];
    }
    i = j;
  }
  zOut[i] = 0;
  *pnOut = i;
}